

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextIndex::append(ImGuiTextIndex *this,char *base,int old_size,int new_size)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  char *__s;
  
  if (old_size != new_size) {
    if (((long)this->EndOffset == 0) || (base[(long)this->EndOffset + -1] == '\n')) {
      iVar7 = (this->LineOffsets).Size;
      iVar2 = (this->LineOffsets).Capacity;
      if (iVar7 == iVar2) {
        iVar7 = iVar7 + 1;
        if (iVar2 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar2 / 2 + iVar2;
        }
        if (iVar7 < iVar6) {
          iVar7 = iVar6;
        }
        if (iVar2 < iVar7) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar3 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar3 = *piVar3 + 1;
          }
          piVar4 = (int *)(*GImAllocatorAllocFunc)((long)iVar7 << 2,GImAllocatorUserData);
          piVar3 = (this->LineOffsets).Data;
          if (piVar3 != (int *)0x0) {
            memcpy(piVar4,piVar3,(long)(this->LineOffsets).Size << 2);
            piVar3 = (this->LineOffsets).Data;
            if ((piVar3 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(piVar3,GImAllocatorUserData);
          }
          (this->LineOffsets).Data = piVar4;
          (this->LineOffsets).Capacity = iVar7;
        }
      }
      (this->LineOffsets).Data[(this->LineOffsets).Size] = this->EndOffset;
      (this->LineOffsets).Size = (this->LineOffsets).Size + 1;
    }
    pvVar5 = memchr(base + old_size,10,(long)new_size - (long)old_size);
    if (pvVar5 != (void *)0x0) {
      do {
        __s = (char *)((long)pvVar5 + 1);
        if (__s < base + new_size) {
          iVar7 = (this->LineOffsets).Size;
          iVar2 = (this->LineOffsets).Capacity;
          if (iVar7 == iVar2) {
            if (iVar2 == 0) {
              iVar6 = 8;
            }
            else {
              iVar6 = iVar2 / 2 + iVar2;
            }
            iVar7 = iVar7 + 1;
            if (iVar7 < iVar6) {
              iVar7 = iVar6;
            }
            if (iVar2 < iVar7) {
              if (GImGui != (ImGuiContext *)0x0) {
                piVar3 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar3 = *piVar3 + 1;
              }
              piVar4 = (int *)(*GImAllocatorAllocFunc)((long)iVar7 << 2,GImAllocatorUserData);
              piVar3 = (this->LineOffsets).Data;
              if (piVar3 != (int *)0x0) {
                memcpy(piVar4,piVar3,(long)(this->LineOffsets).Size << 2);
                piVar3 = (this->LineOffsets).Data;
                if ((piVar3 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                  piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar1 = *piVar1 + -1;
                }
                (*GImAllocatorFreeFunc)(piVar3,GImAllocatorUserData);
              }
              (this->LineOffsets).Data = piVar4;
              (this->LineOffsets).Capacity = iVar7;
            }
          }
          (this->LineOffsets).Data[(this->LineOffsets).Size] = (int)__s - (int)base;
          (this->LineOffsets).Size = (this->LineOffsets).Size + 1;
        }
        pvVar5 = memchr(__s,10,(long)(base + new_size) - (long)__s);
      } while (pvVar5 != (void *)0x0);
    }
    if (new_size < this->EndOffset) {
      new_size = this->EndOffset;
    }
    this->EndOffset = new_size;
  }
  return;
}

Assistant:

void ImGuiTextIndex::append(const char* base, int old_size, int new_size)
{
    IM_ASSERT(old_size >= 0 && new_size >= old_size && new_size >= EndOffset);
    if (old_size == new_size)
        return;
    if (EndOffset == 0 || base[EndOffset - 1] == '\n')
        LineOffsets.push_back(EndOffset);
    const char* base_end = base + new_size;
    for (const char* p = base + old_size; (p = (const char*)memchr(p, '\n', base_end - p)) != 0; )
        if (++p < base_end) // Don't push a trailing offset on last \n
            LineOffsets.push_back((int)(intptr_t)(p - base));
    EndOffset = ImMax(EndOffset, new_size);
}